

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

CTypeID cp_decl_struct(CPState *cp,CPDecl *sdecl,CTInfo sinfo)

{
  CType *pCVar1;
  ushort uVar2;
  CTypeID CVar3;
  CPscl CVar4;
  CTypeID ctypeid;
  CTypeID CVar5;
  CTInfo CVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  CType *pCVar11;
  uint uVar12;
  uint uVar13;
  CTSize CVar14;
  CTState *cts;
  int *piVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  FPRCBArg *pFVar19;
  CTypeID CVar20;
  bool bVar21;
  CType *ct;
  uint local_6f0;
  CType *local_6e0;
  ulong local_6d8;
  ulong local_6d0;
  uint local_6c8;
  uint local_6c4;
  long local_6c0;
  CTState *local_6b8;
  CPDecl local_6b0;
  
  CVar3 = cp_struct_name(cp,sdecl,sinfo);
  if (cp->tok == 0x7b) {
    cp_next(cp);
    CVar5 = CVar3;
    if (cp->tok != 0x7d) {
      bVar21 = false;
LAB_0013b46b:
      CVar4 = cp_decl_spec(cp,&local_6b0,0x20000);
      local_6b0.mode = 4;
      CVar20 = CVar5;
      if (CVar4 == 0) {
        local_6b0.mode = 0xe;
      }
      do {
        if (bVar21) {
          cp_err_token(cp,0x7d);
        }
        local_6b0.bits = 0xffffffff;
        cp_declarator(cp,&local_6b0);
        ctypeid = cp_decl_intern(cp,&local_6b0);
        if ((CVar4 >> 0x11 & 1) == 0) {
          CVar5 = lj_ctype_new(cp->cts,&local_6e0);
          pCVar1 = cp->cts->tab;
          uVar18 = pCVar1[ctypeid].info;
          pCVar11 = pCVar1 + ctypeid;
          if (local_6b0.bits == 0xffffffff) {
            bVar21 = false;
            if ((uVar18 & 0xf0000000) == 0x30000000) {
              bVar21 = pCVar11->size == 0xffffffff;
            }
            CVar14 = 0x7f;
            if (local_6b0.name != (GCstr *)0x0) goto LAB_0013b5d2;
            if ((uVar18 & 0xf0000000) != 0x50000000 && (uVar18 & 0xf0100000) != 0x10000000) {
              cp_err_token(cp,0x100);
            }
            local_6e0->info = ctypeid + 0x80030000;
            uVar18 = local_6b0.attr | 0x80000000;
            if ((pCVar11->info & 0xf0000000) != 0x10000000) {
              uVar18 = 0;
            }
            local_6e0->size = uVar18;
          }
          else {
            if ((((uVar18 & 0xf4000000) != 0) ||
                (local_6b0.bits == 0 && local_6b0.name != (GCstr *)0x0)) ||
               (uVar8 = pCVar11->size << 3, 0x20 < uVar8)) {
LAB_0013b9af:
              cp_errmsg(cp,0x3a,LJ_ERR_BADVAL);
            }
            if (0x7ffffff < uVar18) {
              uVar8 = 1;
            }
            if (uVar8 < local_6b0.bits) goto LAB_0013b9af;
            bVar21 = false;
            CVar14 = local_6b0.bits;
LAB_0013b5d2:
            local_6e0->info = ctypeid + CVar14 * 0x10000 + 0x90000000;
            local_6e0->size = local_6b0.attr;
            if (local_6b0.name != (GCstr *)0x0) {
              (local_6b0.name)->marked = (local_6b0.name)->marked | 0x20;
              (local_6e0->name).gcptr32 = (uint32_t)local_6b0.name;
            }
          }
          pCVar1[CVar20].sib = (CTypeID1)CVar5;
        }
        else {
          CVar5 = cp_decl_constinit(cp,&local_6e0,ctypeid);
          cp->cts->tab[CVar20].sib = (CTypeID1)CVar5;
          (local_6b0.name)->marked = (local_6b0.name)->marked | 0x20;
          (local_6e0->name).gcptr32 = (uint32_t)local_6b0.name;
          bVar21 = false;
        }
        if (cp->tok != 0x2c) goto LAB_0013b6a1;
        cp_next(cp);
        local_6b0.pos = local_6b0.specpos;
        local_6b0.top = local_6b0.specpos + 1;
        local_6b0.stack[local_6b0.specpos].next = 0;
        local_6b0.attr = local_6b0.specattr;
        local_6b0.fattr = local_6b0.specfattr;
        local_6b0.name = (GCstr *)0x0;
        local_6b0.redir = (GCstr *)0x0;
        CVar20 = CVar5;
      } while( true );
    }
LAB_0013b6b9:
    cp_check(cp,0x7d);
    cp->cts->tab[CVar5].sib = 0;
    cp_decl_attributes(cp,sdecl);
    local_6c8 = sdecl->attr;
    uVar18 = local_6c8 >> 0x10 & 0xf;
    cts = (CTState *)cp->cts->tab;
    uVar7 = (ulong)CVar3;
    local_6c0 = uVar7 * 0x10;
    local_6f0 = *(uint *)((cts->cb).fpr + uVar7 * 2 + -6);
    uVar2 = *(ushort *)((cts->cb).fpr + uVar7 * 2 + -5);
    if (uVar2 == 0) {
      local_6d0 = 0;
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      local_6d0 = 0;
      local_6b8 = cts;
      do {
        local_6d8 = (ulong)uVar2;
        uVar16 = (uint)uVar2;
        uVar7 = (ulong)uVar2;
        uVar12 = *(uint *)((cts->cb).fpr + uVar7 * 2 + -6);
        uVar10 = *(uint *)((long)(cts->cb).fpr + uVar7 * 0x10 + -0x2c);
        if (((uVar12 & 0xf0000000) == 0x90000000) ||
           (uVar10 != 0 && (uVar12 & 0xf0ff0000) == 0x80030000)) {
          local_6c4 = uVar12 & 0xffff;
          CVar6 = lj_ctype_info(cts,local_6c4,&local_6b0.top);
          if (((0x1fffffff < local_6b0.top) ||
              ((uVar13 = local_6b0.top * 8, ~uVar8 < uVar13 || ((CVar6 & 0x100000) != 0)))) &&
             ((local_6b0.top != 0xffffffff ||
              (((CVar6 & 0xf0000000) != 0x30000000 || (uVar13 = 0, (local_6f0 & 0x800000) != 0))))))
          {
            cp_err(cp,LJ_ERR_FFI_INVSIZE);
          }
          if (((uVar10 | local_6c8) & 2) == 0) {
            uVar16 = CVar6 >> 0x10 & 0xf;
            if (((uVar10 & 1) != 0) && (uVar9 = uVar10 >> 0x10 & 0xf, uVar16 < uVar9)) {
              uVar16 = uVar9;
            }
          }
          else {
            uVar16 = uVar10 >> 0x10 & 0xf;
          }
          pFVar19 = (local_6b8->cb).fpr + uVar7 * 2 + -6;
          uVar9 = (uint)cp->packstack[cp->curpack];
          if (uVar16 < cp->packstack[cp->curpack]) {
            uVar9 = uVar16;
          }
          if (uVar18 < uVar9) {
            uVar18 = uVar9;
          }
          iVar17 = 8 << ((byte)uVar9 & 0x1f);
          uVar16 = iVar17 - 1;
          uVar9 = uVar12 >> 0x10 & 0x7f;
          if ((uVar12 & 0xf0000000) == 0x90000000 && uVar9 != 0x7f) {
            if (((uVar10 & 1) != 0 || uVar9 == 0) ||
               ((((uVar10 | local_6c8) & 2) == 0 && (uVar13 < (uVar16 & uVar8) + uVar9)))) {
              uVar8 = -iVar17 & uVar8 + uVar16;
            }
            if ((uVar9 == uVar13) && ((uVar16 & uVar8) == 0)) {
              pFVar19->f[0] = (float)(local_6c4 | 0x90000000);
              uVar12 = uVar8;
            }
            else {
              pFVar19->f[0] =
                   (float)((uVar13 - 1 & uVar8) + (uVar9 << 8 | CVar6 & 0xb800000) + uVar13 * 0x2000
                          + 0xa0000000);
              uVar12 = -uVar13;
              uVar13 = uVar9;
              uVar12 = uVar12 & uVar8;
            }
          }
          else {
            uVar8 = -iVar17 & uVar16 + uVar8;
            uVar12 = uVar8;
          }
          uVar16 = (uint)local_6d8;
          uVar10 = (uint)local_6d0;
          if ((uint)local_6d0 < uVar13) {
            uVar10 = uVar13;
          }
          pFVar19->f[1] = (float)(uVar12 >> 3);
          local_6d0 = local_6d0 & 0xffffffff;
          if ((local_6f0 >> 0x17 & 1) != 0) {
            local_6d0 = (ulong)uVar10;
            uVar13 = 0;
          }
          uVar8 = uVar8 + uVar13;
          cts = local_6b8;
          local_6f0 = CVar6 & 0x3100000 | local_6f0;
        }
        uVar2 = *(ushort *)((long)(cts->cb).fpr + ((ulong)(uVar16 << 4) - 0x28));
      } while (uVar2 != 0);
    }
    piVar15 = (int *)((long)(cts->cb).fpr + local_6c0 + -0x30);
    *piVar15 = uVar18 * 0x10000 + local_6f0;
    uVar12 = (uint)local_6d0;
    if ((local_6f0 >> 0x17 & 1) == 0) {
      uVar12 = uVar8;
    }
    iVar17 = 8 << ((byte)uVar18 & 0x1f);
    piVar15[1] = (-iVar17 & (iVar17 + uVar12) - 1) >> 3;
  }
  return CVar3;
LAB_0013b6a1:
  cp_check(cp,0x3b);
  if (cp->tok == 0x7d) goto LAB_0013b6b9;
  goto LAB_0013b46b;
}

Assistant:

static CTypeID cp_decl_struct(CPState *cp, CPDecl *sdecl, CTInfo sinfo)
{
  CTypeID sid = cp_struct_name(cp, sdecl, sinfo);
  if (cp_opt(cp, '{')) {  /* Struct/union definition. */
    CTypeID lastid = sid;
    int lastdecl = 0;
    while (cp->tok != '}') {
      CPDecl decl;
      CPscl scl = cp_decl_spec(cp, &decl, CDF_STATIC);
      decl.mode = scl ? CPARSE_MODE_DIRECT :
	CPARSE_MODE_DIRECT|CPARSE_MODE_ABSTRACT|CPARSE_MODE_FIELD;

      for (;;) {
	CTypeID ctypeid;

	if (lastdecl) cp_err_token(cp, '}');

	/* Parse field declarator. */
	decl.bits = CTSIZE_INVALID;
	cp_declarator(cp, &decl);
	ctypeid = cp_decl_intern(cp, &decl);

	if ((scl & CDF_STATIC)) {  /* Static constant in struct namespace. */
	  CType *ct;
	  CTypeID fieldid = cp_decl_constinit(cp, &ct, ctypeid);
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	  ctype_setname(ct, decl.name);
	} else {
	  CTSize bsz = CTBSZ_FIELD;  /* Temp. for layout phase. */
	  CType *ct;
	  CTypeID fieldid = lj_ctype_new(cp->cts, &ct);  /* Do this first. */
	  CType *tct = ctype_raw(cp->cts, ctypeid);

	  if (decl.bits == CTSIZE_INVALID) {  /* Regular field. */
	    if (ctype_isarray(tct->info) && tct->size == CTSIZE_INVALID)
	      lastdecl = 1;  /* a[] or a[?] must be the last declared field. */

	    /* Accept transparent struct/union/enum. */
	    if (!decl.name) {
	      if (!((ctype_isstruct(tct->info) && !(tct->info & CTF_VLA)) ||
		    ctype_isenum(tct->info)))
		cp_err_token(cp, CTOK_IDENT);
	      ct->info = CTINFO(CT_ATTRIB, CTATTRIB(CTA_SUBTYPE) + ctypeid);
	      ct->size = ctype_isstruct(tct->info) ?
			 (decl.attr|0x80000000u) : 0;  /* For layout phase. */
	      goto add_field;
	    }
	  } else {  /* Bitfield. */
	    bsz = decl.bits;
	    if (!ctype_isinteger_or_bool(tct->info) ||
		(bsz == 0 && decl.name) || 8*tct->size > CTBSZ_MAX ||
		bsz > ((tct->info & CTF_BOOL) ? 1 : 8*tct->size))
	      cp_errmsg(cp, ':', LJ_ERR_BADVAL);
	  }

	  /* Create temporary field for layout phase. */
	  ct->info = CTINFO(CT_FIELD, ctypeid + (bsz << CTSHIFT_BITCSZ));
	  ct->size = decl.attr;
	  if (decl.name) ctype_setname(ct, decl.name);

	add_field:
	  ctype_get(cp->cts, lastid)->sib = fieldid;
	  lastid = fieldid;
	}
	if (!cp_opt(cp, ',')) break;
	cp_decl_reset(&decl);
      }
      cp_check(cp, ';');
    }
    cp_check(cp, '}');
    ctype_get(cp->cts, lastid)->sib = 0;  /* Drop sib = 1 for empty structs. */
    cp_decl_attributes(cp, sdecl);  /* Layout phase needs postfix attributes. */
    cp_struct_layout(cp, sid, sdecl->attr);
  }
  return sid;
}